

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disflow.c
# Opt level: O0

void aom_compute_flow_at_point_c
               (uint8_t *src,uint8_t *ref,int x,int y,int width,int height,int stride,double *u,
               double *v)

{
  int16_t *dx_00;
  int in_ECX;
  int in_EDX;
  long in_RDI;
  double dVar1;
  double dVar2;
  double dVar3;
  int in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  double step_v;
  double step_u;
  int itr;
  uint8_t *src_patch;
  int16_t dy [64];
  int16_t dx [64];
  int b [2];
  double M_inv [4];
  double M [4];
  double *in_stack_fffffffffffffe60;
  undefined8 in_stack_fffffffffffffe68;
  int16_t *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe7c;
  int iVar4;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  int16_t *in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffebc;
  uint8_t *in_stack_fffffffffffffec0;
  int local_70;
  int local_6c;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48 [8];
  
  iVar4 = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
  dx_00 = (int16_t *)(in_RDI + (in_ECX * in_stack_00000008 + in_EDX));
  sobel_filter(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  sobel_filter(in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  compute_flow_matrix(dx_00,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe70,iVar4,
                      in_stack_fffffffffffffe60);
  invert_2x2(local_48,&local_68);
  iVar4 = 0;
  while( true ) {
    if (3 < iVar4) {
      return;
    }
    compute_flow_vector((uint8_t *)dy._64_8_,(uint8_t *)dy._56_8_,dy._52_4_,dy._48_4_,dy._44_4_,
                        dy._40_4_,dy._80_4_,(double)dy._32_8_,(double)dy._24_8_,(int16_t *)dy._88_8_
                        ,(int16_t *)dy._96_8_,(int *)dy._104_8_);
    dVar1 = local_68 * (double)local_70 + local_60 * (double)local_6c;
    dVar2 = local_58 * (double)local_70 + local_50 * (double)local_6c;
    dVar3 = fclamp(dVar1 * 1.0,-2.0,2.0);
    *in_stack_00000010 = dVar3 + *in_stack_00000010;
    dVar3 = fclamp(dVar2 * 1.0,-2.0,2.0);
    *in_stack_00000018 = dVar3 + *in_stack_00000018;
    if (ABS(dVar1) + ABS(dVar2) < 0.125) break;
    iVar4 = iVar4 + 1;
  }
  return;
}

Assistant:

void aom_compute_flow_at_point_c(const uint8_t *src, const uint8_t *ref, int x,
                                 int y, int width, int height, int stride,
                                 double *u, double *v) {
  double M[4];
  double M_inv[4];
  int b[2];
  int16_t dx[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];
  int16_t dy[DISFLOW_PATCH_SIZE * DISFLOW_PATCH_SIZE];

  // Compute gradients within this patch
  const uint8_t *src_patch = &src[y * stride + x];
  sobel_filter(src_patch, stride, dx, DISFLOW_PATCH_SIZE, 1);
  sobel_filter(src_patch, stride, dy, DISFLOW_PATCH_SIZE, 0);

  compute_flow_matrix(dx, DISFLOW_PATCH_SIZE, dy, DISFLOW_PATCH_SIZE, M);
  invert_2x2(M, M_inv);

  for (int itr = 0; itr < DISFLOW_MAX_ITR; itr++) {
    compute_flow_vector(src, ref, width, height, stride, x, y, *u, *v, dx, dy,
                        b);

    // Solve flow equations to find a better estimate for the flow vector
    // at this point
    const double step_u = M_inv[0] * b[0] + M_inv[1] * b[1];
    const double step_v = M_inv[2] * b[0] + M_inv[3] * b[1];
    *u += fclamp(step_u * DISFLOW_STEP_SIZE, -2, 2);
    *v += fclamp(step_v * DISFLOW_STEP_SIZE, -2, 2);

    if (fabs(step_u) + fabs(step_v) < DISFLOW_STEP_SIZE_THRESOLD) {
      // Stop iteration when we're close to convergence
      break;
    }
  }
}